

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O0

Slice * Imf_2_5::Slice::Make
                  (PixelType type,void *ptr,Box2i *dataWindow,size_t xStride,size_t yStride,
                  int xSampling,int ySampling,double fillValue,bool xTileCoords,bool yTileCoords)

{
  Slice *in_RDI;
  bool in_stack_00000166;
  bool in_stack_00000167;
  double in_stack_00000168;
  int64_t in_stack_00000170;
  int64_t in_stack_00000178;
  V2i *in_stack_00000180;
  void *in_stack_00000188;
  PixelType in_stack_00000194;
  size_t in_stack_000001a0;
  size_t in_stack_000001a8;
  int in_stack_000001b0;
  int in_stack_000001b8;
  
  Make(in_stack_00000194,in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
       in_stack_000001a0,in_stack_000001a8,in_stack_000001b0,in_stack_000001b8,in_stack_00000168,
       in_stack_00000167,in_stack_00000166);
  return in_RDI;
}

Assistant:

Slice
Slice::Make (
    PixelType                     type,
    const void*                   ptr,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    size_t                        xStride,
    size_t                        yStride,
    int                           xSampling,
    int                           ySampling,
    double                        fillValue,
    bool                          xTileCoords,
    bool                          yTileCoords)
{
    return Make (
        type,
        ptr,
        dataWindow.min,
        static_cast<int64_t> (dataWindow.max.x) -
            static_cast<int64_t> (dataWindow.min.x) + 1,
        static_cast<int64_t> (dataWindow.max.y) -
            static_cast<int64_t> (dataWindow.min.y) + 1,
        xStride,
        yStride,
        xSampling,
        ySampling,
        fillValue,
        xTileCoords,
        yTileCoords);
}